

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus ZyanVectorDeleteRange(ZyanVector *vector,ZyanUSize index,ZyanUSize count)

{
  ZyanUSize local_48;
  ZyanUSize ZStack_30;
  ZyanStatus status_047620348;
  ZyanUSize i;
  ZyanUSize count_local;
  ZyanUSize index_local;
  ZyanVector *vector_local;
  
  if ((vector == (ZyanVector *)0x0) || (count == 0)) {
    vector_local._4_4_ = 0x80100004;
  }
  else if (vector->size < index + count) {
    vector_local._4_4_ = 0x80100008;
  }
  else {
    ZStack_30 = index;
    if (vector->destructor != (ZyanMemberProcedure)0x0) {
      for (; ZStack_30 < index + count; ZStack_30 = ZStack_30 + 1) {
        (*vector->destructor)((void *)((long)vector->data + ZStack_30 * vector->element_size));
      }
    }
    if ((vector->size <= index + count) ||
       (vector_local._4_4_ = ZyanVectorShiftLeft(vector,index,count),
       (vector_local._4_4_ & 0x80000000) == 0)) {
      vector->size = vector->size - count;
      if ((vector->shrink_threshold == '\0') ||
         (vector->capacity <= vector->size * (ulong)vector->shrink_threshold)) {
        vector_local._4_4_ = 0x100000;
      }
      else {
        if (vector->size * (ulong)vector->growth_factor == 0) {
          local_48 = 1;
        }
        else {
          local_48 = vector->size * (ulong)vector->growth_factor;
        }
        vector_local._4_4_ = ZyanVectorReallocate(vector,local_48);
      }
    }
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorDeleteRange(ZyanVector* vector, ZyanUSize index, ZyanUSize count)
{
    if (!vector || !count)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (index + count > vector->size)
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (vector->destructor)
    {
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            vector->destructor(ZYCORE_VECTOR_OFFSET(vector, i));
        }
    }

    if (index + count < vector->size)
    {
        ZYAN_CHECK(ZyanVectorShiftLeft(vector, index, count));
    }

    vector->size -= count;
    if (ZYCORE_VECTOR_SHOULD_SHRINK(vector->size, vector->capacity, vector->shrink_threshold))
    {
        return ZyanVectorReallocate(vector,
            ZYAN_MAX(1, (ZyanUSize)(vector->size * vector->growth_factor)));
    }

    return ZYAN_STATUS_SUCCESS;
}